

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

bool __thiscall
tsbp::TwoStepBranchingProcedure::PlaceAtCurrentX
          (TwoStepBranchingProcedure *this,Node *node,Rectangle *item)

{
  ulong *puVar1;
  uint uVar2;
  PackingRelaxed2D *packing;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  size_t local_38;
  
  packing = (node->Packing)._M_t.
            super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
            ._M_t.
            super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
            .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl;
  bVar5 = IsPlacementFeasible(this,packing,item);
  if (!bVar5) {
    return bVar5;
  }
  (packing->ItemCoordinatesX).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[(node->super_BaseNode).ItemIdToPlace] = (int)packing->MinX;
  sVar7 = UpdatePlacedAreaAndDetermineLoss(this,packing,item);
  uVar2 = item->InternId;
  uVar10 = (ulong)(int)uVar2;
  if (uVar10 + 1 <= (packing->PlaceableItemsAtCurrentX).m_num_bits) {
    local_40 = &packing->PlaceableItemsAtCurrentX;
    if (uVar10 != 0xffffffffffffffff) {
      uVar11 = uVar2 & 0x3f;
      puVar3 = (local_40->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((uVar2 < 0x40) ||
         (lVar9 = (uVar10 >> 6) - (ulong)(uVar11 != 0x3f), local_38 = sVar7,
         memset(puVar3,0,(lVar9 + 1 + (ulong)(lVar9 == -1)) * 8), sVar7 = local_38, uVar11 != 0x3f))
      {
        uVar8 = 0;
        if (uVar11 != 0x3f) {
          uVar8 = -2L << (sbyte)uVar11;
        }
        puVar1 = puVar3 + (uVar10 >> 6);
        *puVar1 = *puVar1 & uVar8;
      }
    }
    if ((packing->PlacedAreaVector).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[packing->MinX] ==
        (long)(this->container).super_Rectangle.Dy) {
      packing->MinX = sVar7;
      packing->MinimumRemainingItemDyAtCurrentX = packing->MinimumRemainingItemDy;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (&local_68,&packing->PlacedItems);
      if (&local_68 != local_40) {
        puVar3 = (packing->PlaceableItemsAtCurrentX).m_bits.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar4 = *(pointer *)((long)&(packing->PlaceableItemsAtCurrentX).m_bits + 0x10);
        (packing->PlaceableItemsAtCurrentX).m_bits.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((long)&(packing->PlaceableItemsAtCurrentX).m_bits + 8) =
             local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((long)&(packing->PlaceableItemsAtCurrentX).m_bits + 0x10) =
             local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar3 == (pointer)0x0) {
          (packing->PlaceableItemsAtCurrentX).m_num_bits = local_68.m_num_bits;
          local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        else {
          operator_delete(puVar3,(long)puVar4 - (long)puVar3);
          puVar4 = local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar3 = local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (packing->PlaceableItemsAtCurrentX).m_num_bits = local_68.m_num_bits;
          local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((puVar3 != (pointer)0x0) &&
             (operator_delete(puVar3,(long)puVar4 - (long)puVar3),
             local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish)) {
            __assert_fail("(b.m_bits = buffer_type()).empty()",
                          "/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2e7,
                          "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator=(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                         );
          }
        }
        local_68.m_num_bits = 0;
      }
      bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_68);
      if (!bVar6) {
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if (local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                (local_40,(long)item->InternId);
    }
    return bVar5;
  }
  __assert_fail("pos + len <= m_num_bits","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                0x7f3,
                "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::range_operation(size_type, size_type, Block (*)(Block, size_type, size_type), Block (*)(Block)) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

bool TwoStepBranchingProcedure::PlaceAtCurrentX(Node& node, const Rectangle& item)
{
    PackingRelaxed2D& packing = *node.Packing;

    if (IsPlacementFeasible(packing, item))
    {
        packing.ItemCoordinatesX[node.ItemIdToPlace] = packing.MinX;

        size_t newCandidateX = UpdatePlacedAreaAndDetermineLoss(packing, item);
        ////size_t newX = UpdatePlacedAreaAndDetermineLossSS1(packing, item);

        packing.PlaceableItemsAtCurrentX.reset(0, (size_t)item.InternId + 1);

        if (packing.PlacedAreaVector[packing.MinX] == container.Dy)
        {
            packing.MinX = newCandidateX;

            // Must be reset because newX > packingMinX.
            // This lower bound can be raised by determining the remaining minY at newX at a cost of O(n) or by solving a subset sum problem in O(nC).
            packing.MinimumRemainingItemDyAtCurrentX = packing.MinimumRemainingItemDy;
            packing.PlaceableItemsAtCurrentX = ~packing.PlacedItems;
            packing.PlaceableItemsAtCurrentX.reset((size_t)item.InternId);
        }

        return true;
    }

    // Placement was infeasible.
    return false;
}